

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq_cyclicrefresh.c
# Opt level: O0

int compute_deltaq(AV1_COMP *cpi,int q,double rate_factor)

{
  long lVar1;
  int in_ESI;
  long in_RDI;
  int deltaq;
  AV1_COMP *unaff_retaddr;
  CYCLIC_REFRESH *cr;
  undefined4 local_24;
  undefined4 in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_RDI + 0x712a8);
  local_24 = av1_compute_qdelta_by_rate
                       (unaff_retaddr,(FRAME_TYPE)((ulong)in_RDI >> 0x38),(int)in_RDI,
                        (double)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  if ((*(int *)(lVar1 + 8) * in_ESI) / 100 < -local_24) {
    local_24 = (-*(int *)(lVar1 + 8) * in_ESI) / 100;
  }
  return local_24;
}

Assistant:

static int compute_deltaq(const AV1_COMP *cpi, int q, double rate_factor) {
  const CYCLIC_REFRESH *const cr = cpi->cyclic_refresh;
  int deltaq = av1_compute_qdelta_by_rate(
      cpi, cpi->common.current_frame.frame_type, q, rate_factor);
  if ((-deltaq) > cr->max_qdelta_perc * q / 100) {
    deltaq = -cr->max_qdelta_perc * q / 100;
  }
  return deltaq;
}